

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

void Gia_ManArePrintCube(Gia_ManAre_t *p,Gia_StaAre_t *pSta)

{
  Gia_Man_t *p_00;
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  uint local_30;
  uint local_2c;
  int Count2;
  int Count1;
  int Count0;
  int i;
  Gia_Obj_t *pObj;
  Gia_StaAre_t *pSta_local;
  Gia_ManAre_t *p_local;
  
  Count2 = 0;
  local_2c = 0;
  local_30 = 0;
  printf("%4d %4d :  ",(ulong)(uint)p->iStaCur,(ulong)(p->nStas - 1));
  uVar1 = Gia_Ptr2Int(pSta->iPrev);
  printf("Prev %4d   ",(ulong)uVar1);
  printf("%p   ",pSta);
  Count1 = 0;
  while( true ) {
    iVar2 = Gia_ManRegNum(p->pAig);
    bVar4 = false;
    if (Count1 < iVar2) {
      p_00 = p->pAig;
      iVar2 = Gia_ManPoNum(p->pAig);
      pGVar3 = Gia_ManCo(p_00,iVar2 + Count1);
      bVar4 = pGVar3 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar2 = Gia_StaHasValue0(pSta,Count1);
    if (iVar2 == 0) {
      iVar2 = Gia_StaHasValue1(pSta,Count1);
      if (iVar2 == 0) {
        printf("-");
        local_30 = local_30 + 1;
      }
      else {
        printf("1");
        local_2c = local_2c + 1;
      }
    }
    else {
      printf("0");
      Count2 = Count2 + 1;
    }
    Count1 = Count1 + 1;
  }
  printf("  0 =%3d",(ulong)(uint)Count2);
  printf("  1 =%3d",(ulong)local_2c);
  printf("  - =%3d",(ulong)local_30);
  printf("\n");
  return;
}

Assistant:

void Gia_ManArePrintCube( Gia_ManAre_t * p, Gia_StaAre_t * pSta )
{
    Gia_Obj_t * pObj;
    int i, Count0 = 0, Count1 = 0, Count2 = 0;
    printf( "%4d %4d :  ", p->iStaCur, p->nStas-1 );
    printf( "Prev %4d   ", Gia_Ptr2Int(pSta->iPrev) );
    printf( "%p   ", pSta );
    Gia_ManForEachRi( p->pAig, pObj, i )
    {
        if ( Gia_StaHasValue0(pSta, i) )
            printf( "0" ), Count0++;
        else if ( Gia_StaHasValue1(pSta, i) )
            printf( "1" ), Count1++;
        else
            printf( "-" ), Count2++;
    }
    printf( "  0 =%3d", Count0 );
    printf( "  1 =%3d", Count1 );
    printf( "  - =%3d", Count2 );
    printf( "\n" );
}